

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O0

immutable_string __thiscall
ut::test_case_impl<agge::tests::ScanlineAdapterTests>::fixture_name
          (test_case_impl<agge::tests::ScanlineAdapterTests> *this)

{
  char *pcVar1;
  DeleterF extraout_RDX;
  immutable_string iVar2;
  allocator local_39;
  string local_38 [40];
  test_case_impl<agge::tests::ScanlineAdapterTests> *this_local;
  
  this_local = this;
  pcVar1 = agge::tests::ScanlineAdapterTests::__suite_name();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  exportable::immutable_basic_string<char>::immutable_basic_string
            ((immutable_basic_string<char> *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  iVar2._deleter = extraout_RDX;
  iVar2._text = (char *)this;
  return iVar2;
}

Assistant:

inline exportable::immutable_string test_case_impl<Fixture>::fixture_name() const
	{	return std::string(Fixture::__suite_name());	}